

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(ON_SimpleArray<ON_3DM_BIG_CHUNK> *this,ON_3DM_BIG_CHUNK *x)

{
  ON__UINT64 OVar1;
  ON__INT64 OVar2;
  ON__UINT64 OVar3;
  undefined8 uVar4;
  ON_3DM_BIG_CHUNK *pOVar5;
  ON__UINT32 OVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT8 OVar10;
  ON__UINT16 OVar11;
  int iVar12;
  ON_3DM_BIG_CHUNK *pOVar13;
  ON_3DM_BIG_CHUNK *pOVar14;
  
  iVar12 = this->m_count;
  pOVar13 = x;
  if (iVar12 == this->m_capacity) {
    iVar12 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar13 = (ON_3DM_BIG_CHUNK *)onmalloc(0x28);
      OVar1 = x->m_end_offset;
      OVar2 = x->m_big_value;
      OVar6 = x->m_typecode;
      OVar7 = x->m_bLongChunk;
      OVar8 = x->m_reserved1;
      OVar9 = x->m_reserved2;
      OVar10 = x->m_reserved3;
      pOVar13->m_start_offset = x->m_start_offset;
      pOVar13->m_end_offset = OVar1;
      pOVar13->m_big_value = OVar2;
      pOVar13->m_typecode = OVar6;
      pOVar13->m_bLongChunk = OVar7;
      pOVar13->m_reserved1 = OVar8;
      pOVar13->m_reserved2 = OVar9;
      pOVar13->m_reserved3 = OVar10;
      OVar7 = x->m_do_crc32;
      OVar11 = x->m_crc16;
      OVar6 = x->m_crc32;
      pOVar13->m_do_crc16 = x->m_do_crc16;
      pOVar13->m_do_crc32 = OVar7;
      pOVar13->m_crc16 = OVar11;
      pOVar13->m_crc32 = OVar6;
    }
    Reserve(this,(long)iVar12);
    pOVar14 = this->m_a;
    if (pOVar14 == (ON_3DM_BIG_CHUNK *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar12 = this->m_count;
  }
  else {
    pOVar14 = this->m_a;
  }
  this->m_count = iVar12 + 1;
  OVar7 = pOVar13->m_do_crc32;
  OVar11 = pOVar13->m_crc16;
  OVar6 = pOVar13->m_crc32;
  pOVar5 = pOVar14 + iVar12;
  pOVar5->m_do_crc16 = pOVar13->m_do_crc16;
  pOVar5->m_do_crc32 = OVar7;
  pOVar5->m_crc16 = OVar11;
  pOVar5->m_crc32 = OVar6;
  OVar1 = pOVar13->m_start_offset;
  OVar3 = pOVar13->m_end_offset;
  uVar4 = *(undefined8 *)&pOVar13->m_typecode;
  pOVar14[iVar12].m_big_value = pOVar13->m_big_value;
  (&pOVar14[iVar12].m_big_value)[1] = uVar4;
  pOVar14[iVar12].m_start_offset = OVar1;
  pOVar14[iVar12].m_end_offset = OVar3;
  if (pOVar13 != x) {
    onfree(pOVar13);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}